

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SpectrumPtexTexture *
pbrt::SpectrumPtexTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  undefined4 extraout_var;
  ColorEncodingHandle encoding;
  string encodingString;
  string filename;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  SpectrumPtexTexture *this;
  
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"filename","");
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  TextureParameterDictionary::GetOneString(&local_70,parameters,&local_90,&local_b0);
  ResolveFilename(&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"encoding","");
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"gamma 2.2","");
  TextureParameterDictionary::GetOneString(&local_70,parameters,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  ColorEncodingHandle::Get(&local_b0,(memory_resource *)&local_70);
  iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x38,8);
  this = (SpectrumPtexTexture *)CONCAT44(extraout_var,iVar3);
  local_90._M_dataplus._M_p = local_b0._M_dataplus._M_p;
  PtexTextureBase::PtexTextureBase
            ((PtexTextureBase *)this,&local_50,(ColorEncodingHandle *)&local_90);
  this->spectrumType = spectrumType;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

SpectrumPtexTexture *SpectrumPtexTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
    std::string encodingString = parameters.GetOneString("encoding", "gamma 2.2");
    ColorEncodingHandle encoding = ColorEncodingHandle::Get(encodingString, alloc);
    return alloc.new_object<SpectrumPtexTexture>(filename, encoding, spectrumType);
}